

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::LabeledDataset::apply(LabeledDataset *this,ADatasetTransformer *t)

{
  pointer pvVar1;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_48;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_28;
  
  (**t->_vptr_ADatasetTransformer)(&local_48,t,&this->inputs);
  local_28.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->inputs).super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->inputs).super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->inputs).super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_28);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_48);
  pvVar1 = (this->inputs).
           super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar1 != (this->inputs).
                super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    this->inputDimension = pvVar1->_M_size;
  }
  return;
}

Assistant:

void apply(ADatasetTransformer &t) {
        inputs = t.apply(inputs);
        if (!inputs.empty()) {
            inputDimension = inputs[0].size();
        }
    }